

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O2

string * google::protobuf::compiler::php::anon_unknown_2::
         RootPhpNamespace<google::protobuf::Descriptor>
                   (string *__return_storage_ptr__,Descriptor *desc,Options *options)

{
  long lVar1;
  string *full_name;
  allocator *paVar2;
  string *psVar3;
  allocator local_a;
  allocator local_9;
  
  lVar1 = *(long *)(*(long *)(desc + 0x10) + 0x78);
  if ((*(byte *)(lVar1 + 0x28) & 0x80) == 0) {
    full_name = *(string **)(*(long *)(desc + 0x10) + 8);
    if (full_name->_M_string_length != 0) {
      PhpName(__return_storage_ptr__,full_name,options);
      return __return_storage_ptr__;
    }
    paVar2 = &local_a;
  }
  else {
    psVar3 = (string *)(*(ulong *)(lVar1 + 0x80) & 0xfffffffffffffffe);
    if (*(long *)(psVar3 + 8) != 0) {
      std::__cxx11::string::string((string *)__return_storage_ptr__,psVar3);
      return __return_storage_ptr__;
    }
    paVar2 = &local_9;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,"",paVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string RootPhpNamespace(const DescriptorType* desc,
                             const Options& options) {
  if (desc->file()->options().has_php_namespace()) {
    const std::string& php_namespace = desc->file()->options().php_namespace();
    if (!php_namespace.empty()) {
      return php_namespace;
    }
    return "";
  }

  if (!desc->file()->package().empty()) {
    return PhpName(desc->file()->package(), options);
  }
  return "";
}